

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter-inl.h
# Opt level: O3

void __thiscall
spdlog::details::E_formatter<spdlog::details::scoped_padder>::format
          (E_formatter<spdlog::details::scoped_padder> *this,log_msg *msg,tm *param_2,
          memory_buf_t *dest)

{
  scoped_padder p;
  scoped_padder sStack_58;
  format_int local_30;
  
  scoped_padder::scoped_padder(&sStack_58,10,&(this->super_flag_formatter).padinfo_,dest);
  local_30.str_ =
       ::fmt::v9::format_int::format_signed<long>(&local_30,(msg->time).__d.__r / 1000000000);
  ::fmt::v9::detail::buffer<char>::append<char>
            (&dest->super_buffer<char>,local_30.str_,local_30.buffer_ + 0x15);
  scoped_padder::~scoped_padder(&sStack_58);
  return;
}

Assistant:

void format(const details::log_msg &msg, const std::tm &, memory_buf_t &dest) override
    {
        const size_t field_size = 10;
        ScopedPadder p(field_size, padinfo_, dest);
        auto duration = msg.time.time_since_epoch();
        auto seconds = std::chrono::duration_cast<std::chrono::seconds>(duration).count();
        fmt_helper::append_int(seconds, dest);
    }